

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLU * curl_url_dup(CURLU *in)

{
  Curl_URL *u;
  char *pcVar1;
  
  u = (Curl_URL *)(*Curl_ccalloc)(0x58,1);
  if (u == (Curl_URL *)0x0) {
    return (CURLU *)0x0;
  }
  if (in->scheme == (char *)0x0) {
LAB_00526834:
    if (in->user != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->user);
      u->user = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00526922;
    }
    if (in->password != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->password);
      u->password = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00526922;
    }
    if (in->options != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->options);
      u->options = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00526922;
    }
    if (in->host != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->host);
      u->host = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00526922;
    }
    if (in->port != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->port);
      u->port = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00526922;
    }
    if (in->path != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->path);
      u->path = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00526922;
    }
    if (in->query != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->query);
      u->query = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00526922;
    }
    if (in->fragment != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->fragment);
      u->fragment = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00526922;
    }
    u->portnum = in->portnum;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(in->scheme);
    u->scheme = pcVar1;
    if (pcVar1 != (char *)0x0) goto LAB_00526834;
LAB_00526922:
    free_urlhandle(u);
    (*Curl_cfree)(u);
    u = (Curl_URL *)0x0;
  }
  return u;
}

Assistant:

CURLU *curl_url_dup(CURLU *in)
{
  struct Curl_URL *u = calloc(sizeof(struct Curl_URL), 1);
  if(u) {
    DUP(u, in, scheme);
    DUP(u, in, user);
    DUP(u, in, password);
    DUP(u, in, options);
    DUP(u, in, host);
    DUP(u, in, port);
    DUP(u, in, path);
    DUP(u, in, query);
    DUP(u, in, fragment);
    u->portnum = in->portnum;
  }
  return u;
  fail:
  curl_url_cleanup(u);
  return NULL;
}